

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.h
# Opt level: O2

void __thiscall
slang::syntax::SpecparamDeclarationSyntax::SpecparamDeclarationSyntax
          (SpecparamDeclarationSyntax *this,
          SyntaxList<slang::syntax::AttributeInstanceSyntax> *attributes,Token keyword,
          ImplicitTypeSyntax *type,
          SeparatedSyntaxList<slang::syntax::SpecparamDeclaratorSyntax> *declarators,Token semi)

{
  size_type sVar1;
  SyntaxKind SVar2;
  undefined4 uVar3;
  ImplicitTypeSyntax *pIVar4;
  SpecparamDeclaratorSyntax *pSVar5;
  undefined8 uVar6;
  SeparatedSyntaxList<slang::syntax::SpecparamDeclaratorSyntax> *__range2;
  iterator_base<slang::syntax::SpecparamDeclaratorSyntax_*> local_38;
  
  uVar6 = keyword._0_8_;
  MemberSyntax::MemberSyntax(&this->super_MemberSyntax,SpecparamDeclaration,attributes);
  (this->keyword).kind = (short)uVar6;
  (this->keyword).field_0x2 = (char)((ulong)uVar6 >> 0x10);
  (this->keyword).numFlags = (NumericTokenFlags)(char)((ulong)uVar6 >> 0x18);
  (this->keyword).rawLen = (int)((ulong)uVar6 >> 0x20);
  (this->keyword).info = keyword.info;
  local_38.list = (ParentList *)type;
  not_null<slang::syntax::ImplicitTypeSyntax*>::not_null<slang::syntax::ImplicitTypeSyntax*,void>
            ((not_null<slang::syntax::ImplicitTypeSyntax*> *)&this->type,
             (ImplicitTypeSyntax **)&local_38);
  SVar2 = (declarators->super_SyntaxListBase).super_SyntaxNode.kind;
  uVar3 = *(undefined4 *)&(declarators->super_SyntaxListBase).super_SyntaxNode.field_0xc;
  (this->declarators).super_SyntaxListBase.super_SyntaxNode.parent =
       (declarators->super_SyntaxListBase).super_SyntaxNode.parent;
  (this->declarators).super_SyntaxListBase.super_SyntaxNode.kind = SVar2;
  *(undefined4 *)&(this->declarators).super_SyntaxListBase.super_SyntaxNode.field_0xc = uVar3;
  (this->declarators).super_SyntaxListBase.childCount =
       (declarators->super_SyntaxListBase).childCount;
  (this->declarators).super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR_getChild_00473cc0;
  sVar1 = (declarators->elements).size_;
  (this->declarators).elements.data_ = (declarators->elements).data_;
  (this->declarators).elements.size_ = sVar1;
  (this->semi).kind = semi.kind;
  (this->semi).field_0x2 = semi._2_1_;
  (this->semi).numFlags = (NumericTokenFlags)semi.numFlags.raw;
  (this->semi).rawLen = semi.rawLen;
  (this->semi).info = semi.info;
  pIVar4 = not_null<slang::syntax::ImplicitTypeSyntax_*>::get(&this->type);
  (pIVar4->super_DataTypeSyntax).super_ExpressionSyntax.super_SyntaxNode.parent = (SyntaxNode *)this
  ;
  (this->declarators).super_SyntaxListBase.super_SyntaxNode.parent = (SyntaxNode *)this;
  local_38.index = 0;
  sVar1 = (this->declarators).elements.size_;
  local_38.list = &this->declarators;
  for (; (local_38.list != &this->declarators || (local_38.index != sVar1 + 1 >> 1));
      local_38.index = local_38.index + 1) {
    pSVar5 = SeparatedSyntaxList<slang::syntax::SpecparamDeclaratorSyntax>::
             iterator_base<slang::syntax::SpecparamDeclaratorSyntax_*>::operator*(&local_38);
    (pSVar5->super_SyntaxNode).parent = (SyntaxNode *)this;
  }
  return;
}

Assistant:

SpecparamDeclarationSyntax(const SyntaxList<AttributeInstanceSyntax>& attributes, Token keyword, ImplicitTypeSyntax& type, const SeparatedSyntaxList<SpecparamDeclaratorSyntax>& declarators, Token semi) :
        MemberSyntax(SyntaxKind::SpecparamDeclaration, attributes), keyword(keyword), type(&type), declarators(declarators), semi(semi) {
        this->type->parent = this;
        this->declarators.parent = this;
        for (auto child : this->declarators)
            child->parent = this;
    }